

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int should_keep_alive(mg_connection *conn)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  vec opt_vec;
  vec eq_vec;
  
  iVar2 = 0;
  if (((conn != (mg_connection *)0x0) && (conn->must_close == 0)) &&
     (iVar1 = mg_strcasecmp(conn->dom_ctx->config[10],"yes"), iVar2 = 0, iVar1 == 0)) {
    pcVar3 = mg_get_header(conn,"Connection");
    if (pcVar3 == (char *)0x0) {
      if (conn->connection_type == 1) {
        lVar4 = 0x30;
      }
      else {
        if (conn->connection_type != 2) {
          return 0;
        }
        lVar4 = 0x4c8;
      }
      pcVar3 = *(char **)((conn->request_info).remote_addr + lVar4 + -0x48);
      if (pcVar3 == (char *)0x0) {
        return 0;
      }
      iVar2 = strcmp(pcVar3,"1.1");
      if (iVar2 != 0) {
        return 0;
      }
    }
    else {
      do {
        pcVar3 = next_option(pcVar3,&opt_vec,&eq_vec);
        if (pcVar3 == (char *)0x0) {
          return 0;
        }
        iVar2 = mg_strncasecmp("keep-alive",opt_vec.ptr,opt_vec.len);
      } while (iVar2 != 0);
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int
should_keep_alive(const struct mg_connection *conn)
{
	const char *http_version;
	const char *header;

	/* First satisfy needs of the server */
	if ((conn == NULL) || conn->must_close) {
		/* Close, if civetweb framework needs to close */
		return 0;
	}

	if (mg_strcasecmp(conn->dom_ctx->config[ENABLE_KEEP_ALIVE], "yes") != 0) {
		/* Close, if keep alive is not enabled */
		return 0;
	}

	/* Check explicit wish of the client */
	header = mg_get_header(conn, "Connection");
	if (header) {
		/* If there is a connection header from the client, obey */
		if (header_has_option(header, "keep-alive")) {
			return 1;
		}
		return 0;
	}

	/* Use default of the standard */
	http_version = get_http_version(conn);
	if (http_version && (0 == strcmp(http_version, "1.1"))) {
		/* HTTP 1.1 default is keep alive */
		return 1;
	}

	/* HTTP 1.0 (and earlier) default is to close the connection */
	return 0;
}